

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HitQueue.h
# Opt level: O2

void __thiscall HitQueue::NextTimeFrame(HitQueue *this)

{
  int iVar1;
  reference pvVar2;
  
  pvVar2 = std::vector<int,_std::allocator<int>_>::at
                     (&this->hitsPerTimeFrame_,(long)this->windowBegin_);
  this->activeHitsSum_ = this->activeHitsSum_ - *pvVar2;
  MoveNext(this);
  iVar1 = sumOfRange(this,this->windowBegin_,this->windowEnd_);
  if (iVar1 == this->activeHitsSum_) {
    return;
  }
  __assert_fail("sumOfRange(windowBegin_, windowEnd_) == activeHitsSum_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/4sily[P]rate-limiter-cpp/HitQueue.h"
                ,0x1a,"void HitQueue::NextTimeFrame()");
}

Assistant:

void NextTimeFrame()
    {
        activeHitsSum_ -= hitsPerTimeFrame_.at(windowBegin_);
        MoveNext();

        CONTRACT_EXPECT(sumOfRange(windowBegin_, windowEnd_) == activeHitsSum_);
    }